

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccf27::preprocessor<baryonyx::problem>::constraints_exclude_copy
          (preprocessor<baryonyx::problem> *this,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *mapping,
          vector<int,_std::allocator<int>_> *constraints_size,
          vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *constraints,
          vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *copy)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference __args;
  const_reference pvVar7;
  function_element *elem;
  const_iterator __end3;
  const_iterator __begin3;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range3;
  int e;
  int i;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *copy_local;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *constraints_local;
  vector<int,_std::allocator<int>_> *constraints_size_local;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *mapping_local;
  preprocessor<baryonyx::problem> *this_local;
  
  __range3._4_4_ = 0;
  iVar3 = baryonyx::length<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                    (constraints);
  for (; __range3._4_4_ != iVar3; __range3._4_4_ = __range3._4_4_ + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (constraints_size,(long)__range3._4_4_);
    if (1 < *pvVar4) {
      std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::emplace_back<>(copy)
      ;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (constraints,(long)__range3._4_4_);
      iVar1 = pvVar5->id;
      pvVar6 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::back(copy);
      pvVar6->id = iVar1;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (constraints,(long)__range3._4_4_);
      pvVar6 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::back(copy);
      (pvVar6->label)._M_len = (pvVar5->label)._M_len;
      (pvVar6->label)._M_str = (pvVar5->label)._M_str;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (constraints,(long)__range3._4_4_);
      iVar1 = pvVar5->value;
      pvVar6 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::back(copy);
      pvVar6->value = iVar1;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (constraints,(long)__range3._4_4_);
      __end3 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::begin(&pvVar5->elements);
      elem = (function_element *)
             std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             end(&pvVar5->elements);
      while (bVar2 = __gnu_cxx::
                     operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                               (&__end3,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                         *)&elem), ((bVar2 ^ 0xffU) & 1) != 0) {
        __args = __gnu_cxx::
                 __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                 ::operator*(&__end3);
        pvVar7 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
                 operator[](mapping,(long)__args->variable_index);
        if (pvVar7->first < 0) {
          pvVar7 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
                   operator[](mapping,(long)__args->variable_index);
          if ((pvVar7->second & 1U) == 1) {
            iVar1 = __args->factor;
            pvVar6 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::back
                               (copy);
            pvVar6->value = pvVar6->value - iVar1;
          }
        }
        else {
          pvVar6 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::back
                             (copy);
          pvVar7 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
                   operator[](mapping,(long)__args->variable_index);
          std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
          emplace_back<int_const&,int_const&>
                    ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                      *)&pvVar6->elements,&__args->factor,&pvVar7->first);
        }
        __gnu_cxx::
        __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
        ::operator++(&__end3);
      }
    }
  }
  return;
}

Assistant:

void constraints_exclude_copy(
      const std::vector<std::pair<int, bool>>& mapping,
      const std::vector<int>& constraints_size,
      const std::vector<bx::constraint>& constraints,
      std::vector<bx::constraint>& copy) const
    {
        for (int i = 0, e = bx::length(constraints); i != e; ++i) {

            // Remaining constraints with one element are undecidable (can be 0
            // or 1) but useless in constraints (e.g. x <= 1) list. We remove
            // it.

            if (constraints_size[i] <= 1)
                continue;

            copy.emplace_back();
            copy.back().id = constraints[i].id;
            copy.back().label = constraints[i].label;
            copy.back().value = constraints[i].value;

            for (const auto& elem : constraints[i].elements) {
                if (mapping[elem.variable_index].first >= 0) {
                    copy.back().elements.emplace_back(
                      elem.factor, mapping[elem.variable_index].first);
                } else {
                    if (mapping[elem.variable_index].second == true) {
                        copy.back().value -= elem.factor;
                    }
                }
            }
        }
    }